

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O0

void VP8LPutBitsInternal(VP8LBitWriter *bw,uint32_t bits,int n_bits)

{
  int iVar1;
  int in_EDX;
  uint in_ESI;
  VP8LBitWriter *in_RDI;
  uint64_t extra_size;
  int used;
  vp8l_atype_t lbits;
  int local_1c;
  ulong local_18;
  
  if (0 < in_EDX) {
    local_18 = in_RDI->bits_;
    for (local_1c = in_RDI->used_; 0x1f < local_1c; local_1c = local_1c + -0x20) {
      if ((in_RDI->end_ < in_RDI->cur_ + 4) &&
         ((iVar1 = CheckSizeOverflow((uint64_t)(in_RDI->end_ + (0x8000 - (long)in_RDI->buf_))),
          iVar1 == 0 || (iVar1 = VP8LBitWriterResize(in_RDI,CONCAT44(in_ESI,in_EDX)), iVar1 == 0))))
      {
        in_RDI->cur_ = in_RDI->buf_;
        in_RDI->error_ = 1;
        return;
      }
      *(int *)in_RDI->cur_ = (int)local_18;
      in_RDI->cur_ = in_RDI->cur_ + 4;
      local_18 = local_18 >> 0x20;
    }
    in_RDI->bits_ = local_18 | (ulong)in_ESI << ((byte)local_1c & 0x3f);
    in_RDI->used_ = local_1c + in_EDX;
  }
  return;
}

Assistant:

void VP8LPutBitsInternal(VP8LBitWriter* const bw, uint32_t bits, int n_bits) {
  assert(n_bits <= 32);
  // That's the max we can handle:
  assert(sizeof(vp8l_wtype_t) == 2);
  if (n_bits > 0) {
    vp8l_atype_t lbits = bw->bits_;
    int used = bw->used_;
    // Special case of overflow handling for 32bit accumulator (2-steps flush).
#if VP8L_WRITER_BITS == 16
    if (used + n_bits >= VP8L_WRITER_MAX_BITS) {
      // Fill up all the VP8L_WRITER_MAX_BITS so it can be flushed out below.
      const int shift = VP8L_WRITER_MAX_BITS - used;
      lbits |= (vp8l_atype_t)bits << used;
      used = VP8L_WRITER_MAX_BITS;
      n_bits -= shift;
      bits >>= shift;
      assert(n_bits <= VP8L_WRITER_MAX_BITS);
    }
#endif
    // If needed, make some room by flushing some bits out.
    while (used >= VP8L_WRITER_BITS) {
      if (bw->cur_ + VP8L_WRITER_BYTES > bw->end_) {
        const uint64_t extra_size = (bw->end_ - bw->buf_) + MIN_EXTRA_SIZE;
        if (!CheckSizeOverflow(extra_size) ||
            !VP8LBitWriterResize(bw, (size_t)extra_size)) {
          bw->cur_ = bw->buf_;
          bw->error_ = 1;
          return;
        }
      }
      *(vp8l_wtype_t*)bw->cur_ = (vp8l_wtype_t)WSWAP((vp8l_wtype_t)lbits);
      bw->cur_ += VP8L_WRITER_BYTES;
      lbits >>= VP8L_WRITER_BITS;
      used -= VP8L_WRITER_BITS;
    }
    bw->bits_ = lbits | ((vp8l_atype_t)bits << used);
    bw->used_ = used + n_bits;
  }
}